

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

bool __thiscall
GEO::PeriodicDelaunay3dThread::tet_is_real_non_periodic(PeriodicDelaunay3dThread *this,index_t t)

{
  uint uVar1;
  pointer piVar2;
  uint uVar3;
  
  if ((this->cell_next_->
      super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
      super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
      super__Vector_impl_data._M_start[t] == 0xfffffffe) {
    uVar3 = t << 2;
    piVar2 = (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (-1 < piVar2[uVar3]) {
      if (((-1 < piVar2[(ulong)uVar3 + 1]) && (-1 < piVar2[(ulong)uVar3 + 2])) &&
         (-1 < piVar2[(ulong)uVar3 + 3])) {
        uVar1 = (this->super_Periodic).nb_vertices_non_periodic_;
        return ((uint)piVar2[(ulong)uVar3 + 3] < uVar1 || (uint)piVar2[(ulong)uVar3 + 2] < uVar1) ||
               ((uint)piVar2[(ulong)uVar3 + 1] < uVar1 || (uint)piVar2[uVar3] < uVar1);
      }
    }
  }
  return false;
}

Assistant:

bool tet_is_in_list(index_t t) const {
            geo_debug_assert(t < max_t());
            return (cell_next_[t] != NOT_IN_LIST);
        }